

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

Allocation __thiscall
density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
inplace_allocate<0ul,true,1ul,1ul>
          (heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>
           *this)

{
  ControlBlock *i_address;
  Allocation AVar1;
  bool bVar2;
  void *i_address_00;
  void *pvVar3;
  void *pvVar4;
  void *end_of_page;
  void *new_element;
  void *new_tail;
  ControlBlock *control_block;
  bool over_aligned;
  bool can_fit_in_a_page;
  size_t size;
  size_t alignment;
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  bVar2 = address_is_aligned(*(void **)(this + 0x38),8);
  if ((!bVar2) && (*(long *)(this + 0x38) != 0xffef)) {
    density_tests::detail::assert_failed<>
              ("address_is_aligned(m_tail, min_alignment) || m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block)"
               ,anon_var_dwarf_12e55,0xac8);
  }
  while( true ) {
    i_address = *(ControlBlock **)(this + 0x38);
    i_address_00 = address_add(i_address,0x10);
    bVar2 = address_is_aligned(i_address_00,8);
    if ((!bVar2) && (*(long *)(this + 0x38) != 0xffef)) {
      density_tests::detail::assert_failed<>
                ("address_is_aligned(new_tail, min_alignment) || m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block)"
                 ,anon_var_dwarf_12e55,0xae0);
    }
    pvVar3 = address_add(i_address_00,8);
    pvVar4 = heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
             ::get_end_of_page(i_address);
    if (pvVar3 <= pvVar4) break;
    heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
    allocate_new_page((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                       *)this);
  }
  i_address->m_next = 0;
  i_address->m_next = (uintptr_t)pvVar3;
  *(void **)(this + 0x38) = pvVar3;
  AVar1.m_user_storage = i_address_00;
  AVar1.m_control_block = i_address;
  return AVar1;
}

Assistant:

Allocation inplace_allocate()
        {
            static_assert(is_power_of_2(ALIGNMENT) && (SIZE % ALIGNMENT) == 0, "");

            DENSITY_ASSERT_INTERNAL(
              address_is_aligned(m_tail, min_alignment) ||
              m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block));

            constexpr size_t alignment = detail::size_max(ALIGNMENT, min_alignment);
            constexpr size_t size      = uint_upper_align(SIZE, alignment);
            constexpr bool   can_fit_in_a_page =
              size + (alignment - min_alignment) <= s_max_size_inpage;
            constexpr bool over_aligned = alignment > min_alignment;

            for (;;)
            {
                // allocate space for the control block and the runtime type
                auto const control_block = m_tail;
                void *     new_tail      = address_add(
                  control_block,
                  INCLUDE_TYPE ? (s_sizeof_ControlBlock + s_sizeof_RuntimeType)
                               : s_sizeof_ControlBlock);

                // allocate space for the element
                if (over_aligned)
                {
                    new_tail = address_upper_align(new_tail, alignment);
                }
                DENSITY_ASSERT_INTERNAL(
                  address_is_aligned(new_tail, min_alignment) ||
                  m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block));
                void * new_element = new_tail;
                new_tail           = address_add(new_tail, size);

                // check if a page overflow would occur
                void * end_of_page = get_end_of_page(control_block);
                if (DENSITY_LIKELY(new_tail <= end_of_page))
                {
                    DENSITY_ASSUME(control_block != nullptr);
                    new (control_block) ControlBlock();

                    control_block->m_next = reinterpret_cast<uintptr_t>(new_tail) + CONTROL_BITS;
                    m_tail                = static_cast<ControlBlock *>(new_tail);
                    return Allocation{control_block, new_element};
                }
                else if (can_fit_in_a_page)
                {
                    // allocate a new page and redo
                    allocate_new_page();
                }
                else
                {
                    // this allocation would never fit in a page, allocate an external block
                    return external_allocate<CONTROL_BITS>(size, alignment);
                }
            }
        }